

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

uint64 mkvmuxer::EbmlElementSize(uint64 type,uint8 *value,uint64 size)

{
  int32 iVar1;
  int32 iVar2;
  uint64 ebml_size;
  uint64 size_local;
  uint8 *value_local;
  uint64 type_local;
  
  if (value == (uint8 *)0x0) {
    type_local = 0;
  }
  else {
    iVar1 = GetUIntSize(type);
    iVar2 = GetCodedUIntSize(size);
    type_local = (long)iVar2 + size + (long)iVar1;
  }
  return type_local;
}

Assistant:

uint64 EbmlElementSize(uint64 type, const uint8* value, uint64 size) {
  if (!value)
    return 0;

  // Size of EBML ID
  uint64 ebml_size = GetUIntSize(type);

  // Datasize
  ebml_size += size;

  // Size of Datasize
  ebml_size += GetCodedUIntSize(size);

  return ebml_size;
}